

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O0

bool TestSepAxis(btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,btTransform *transA,
                btTransform *transB,btVector3 *sep_axis,btScalar *depth,btVector3 *witnessPointA,
                btVector3 *witnessPointB)

{
  btVector3 *in_R8;
  float *in_R9;
  btScalar d1;
  btScalar d0;
  btVector3 witnesPtMaxB;
  btVector3 witnesPtMinB;
  btVector3 witnesPtMaxA;
  btVector3 witnesPtMinA;
  btScalar Max1;
  btScalar Min1;
  btScalar Max0;
  btScalar Min0;
  btVector3 local_88;
  btVector3 local_78;
  btVector3 *in_stack_ffffffffffffff98;
  btScalar *in_stack_ffffffffffffffa0;
  btScalar *in_stack_ffffffffffffffa8;
  btVector3 *in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  bool local_1;
  
  btVector3::btVector3((btVector3 *)&stack0xffffffffffffffa8);
  btVector3::btVector3((btVector3 *)&stack0xffffffffffffff98);
  btVector3::btVector3(&local_78);
  btVector3::btVector3(&local_88);
  btConvexPolyhedron::project
            ((btConvexPolyhedron *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (btTransform *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_R8);
  btConvexPolyhedron::project
            ((btConvexPolyhedron *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (btTransform *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,in_R8);
  if ((in_stack_ffffffffffffffc0 < in_stack_ffffffffffffffbc) ||
     (in_stack_ffffffffffffffb8 < in_stack_ffffffffffffffc4)) {
    local_1 = false;
  }
  else {
    if (in_stack_ffffffffffffffb8 - in_stack_ffffffffffffffc4 <=
        in_stack_ffffffffffffffc0 - in_stack_ffffffffffffffbc) {
      *in_R9 = in_stack_ffffffffffffffb8 - in_stack_ffffffffffffffc4;
      *_d1 = in_stack_ffffffffffffffa8;
      _d1[1] = in_stack_ffffffffffffffb0;
      *(undefined8 *)witnesPtMaxB.m_floats._0_8_ = local_88.m_floats._0_8_;
      *(undefined8 *)(witnesPtMaxB.m_floats._0_8_ + 8) = local_88.m_floats._8_8_;
    }
    else {
      *in_R9 = in_stack_ffffffffffffffc0 - in_stack_ffffffffffffffbc;
      *_d1 = in_stack_ffffffffffffff98;
      _d1[1] = in_stack_ffffffffffffffa0;
      *(undefined8 *)witnesPtMaxB.m_floats._0_8_ = local_78.m_floats._0_8_;
      *(undefined8 *)(witnesPtMaxB.m_floats._0_8_ + 8) = local_78.m_floats._8_8_;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool TestSepAxis(const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, const btVector3& sep_axis, btScalar& depth, btVector3& witnessPointA, btVector3& witnessPointB)
{
	btScalar Min0,Max0;
	btScalar Min1,Max1;
	btVector3 witnesPtMinA,witnesPtMaxA;
	btVector3 witnesPtMinB,witnesPtMaxB;

	hullA.project(transA,sep_axis, Min0, Max0,witnesPtMinA,witnesPtMaxA);
	hullB.project(transB, sep_axis, Min1, Max1,witnesPtMinB,witnesPtMaxB);

	if(Max0<Min1 || Max1<Min0)
		return false;

	btScalar d0 = Max0 - Min1;
	btAssert(d0>=0.0f);
	btScalar d1 = Max1 - Min0;
	btAssert(d1>=0.0f);
	if (d0<d1)
	{
		depth = d0;
		witnessPointA = witnesPtMaxA;
		witnessPointB = witnesPtMinB;

	} else
	{
		depth = d1;
		witnessPointA = witnesPtMinA;
		witnessPointB = witnesPtMaxB;
	}
	
	return true;
}